

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void raviV_op_bnot(lua_State *L,TValue *ra,TValue *rb)

{
  ulong uVar1;
  TValue *io;
  double dVar2;
  undefined1 auVar3 [16];
  
  if (rb->tt_ == 3) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (rb->value_).n;
    auVar3 = vroundsd_avx(auVar3,auVar3,9);
    dVar2 = auVar3._0_8_;
    if (((dVar2 != (rb->value_).n) || (dVar2 < -9.223372036854776e+18)) ||
       (9.223372036854776e+18 <= dVar2)) goto LAB_00135159;
    uVar1 = (ulong)dVar2;
  }
  else {
    if (rb->tt_ != 0x13) {
LAB_00135159:
      luaT_trybinTM(L,rb,rb,ra,TM_BNOT);
      return;
    }
    uVar1 = (rb->value_).i;
  }
  (ra->value_).i = ~uVar1;
  ra->tt_ = 0x13;
  return;
}

Assistant:

void raviV_op_bnot(lua_State *L, TValue *ra, TValue *rb) {
  lua_Integer ib;
  if (tointegerns(rb, &ib)) { setivalue(ra, intop (^, ~l_castS2U(0), ib)); }
  else {
    luaT_trybinTM(L, rb, rb, ra, TM_BNOT);
  }
}